

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O1

int EncodeData(BrotliEncoderStateInternal *s,int is_last,int force_flush,size_t *out_size,
              uint8_t **output)

{
  BrotliHasherParams *pBVar1;
  MemoryManager *m;
  Hasher *hasher;
  size_t *last_insert_len;
  size_t *num_literals;
  ulong *puVar2;
  uint8_t uVar3;
  uint uVar4;
  undefined4 uVar5;
  uint8_t *data;
  undefined4 uVar12;
  uint32_t *puVar6;
  ulong uVar7;
  uint16_t *puVar8;
  void *pvVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  ulong uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar19;
  uint uVar20;
  int iVar21;
  ContextType literal_context_mode;
  uint32_t *buckets;
  uint32_t *puVar22;
  uint8_t *puVar23;
  int *piVar24;
  Command *pCVar25;
  void *pvVar26;
  byte bVar27;
  char cVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  size_t *psVar32;
  uint *params;
  BrotliEncoderParams *extraout_RDX;
  ulong *puVar33;
  ulong *puVar34;
  uint8_t *puVar35;
  uint32_t result;
  ulong uVar36;
  uint8_t *puVar37;
  ulong mask;
  uint32_t uVar38;
  uint uVar39;
  size_t sVar40;
  Hasher *pHVar41;
  uint32_t **ppuVar42;
  HasherCommon *pHVar43;
  byte bVar44;
  ulong *puVar45;
  uint8_t *s1_orig;
  ulong uVar46;
  uint uVar47;
  uint8_t uVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  double dVar56;
  undefined1 auVar57 [16];
  double dVar58;
  uint8_t *puVar59;
  uint8_t *local_a60;
  size_t storage_ix_1;
  uint8_t **local_a40;
  uint8_t *local_a38;
  undefined8 uStack_a30;
  ulong local_a28;
  int *local_a20;
  uint8_t *local_a18;
  Command *local_a10;
  int *local_a08;
  size_t *local_a00;
  size_t *local_9f8;
  uint32_t wrapped_last_processed_pos;
  uint32_t bytes;
  double local_9e8;
  double dStack_9e0;
  uint8_t *local_9d8;
  uint32_t *local_9d0;
  size_t num_literal_contexts;
  size_t local_9c0;
  size_t storage_ix;
  BrotliEncoderParams *pBStack_9b0;
  undefined1 local_9a8 [16];
  uint32_t local_974;
  size_t table_size;
  uint auStack_430 [10];
  BlockSplit local_408;
  BlockSplit local_3d8;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  
  bVar27 = 0;
  uVar36 = s->last_processed_pos_;
  uVar49 = s->input_pos_ - uVar36;
  uVar38 = (uint32_t)uVar49;
  uVar47 = (uint)uVar36;
  if (2 < uVar36 >> 0x1e) {
    uVar47 = ((int)(uVar47 * 2) >> 1 & 0xc0000000U) + (uVar47 & 0x3fffffff) + 0x80000000;
  }
  uVar31 = (s->params).quality;
  data = (s->ringbuffer_).buffer_;
  uVar4 = (s->ringbuffer_).mask_;
  mask = (ulong)uVar4;
  if (s->input_pos_ == uVar36) {
    if (data == (uint8_t *)0x0) {
      if (is_last != 0) {
        uVar19 = (ushort)(3 << (s->last_bytes_bits_ & 0x1f)) | s->last_bytes_;
        s->last_bytes_ = uVar19;
        bVar27 = s->last_bytes_bits_ + 2;
        s->last_bytes_bits_ = bVar27;
        (s->tiny_buf_).u8[0] = (uint8_t)uVar19;
        (s->tiny_buf_).u8[1] = (uint8_t)(uVar19 >> 8);
        *output = (uint8_t *)&s->tiny_buf_;
        *out_size = (ulong)(bVar27 + 7 >> 3);
        return 1;
      }
LAB_01c0415e:
      *out_size = 0;
      return 1;
    }
    if ((is_last == 0) && (force_flush == 0 || uVar31 < 2)) goto LAB_01c0415e;
  }
  if ((s->params).dictionary.max_quality < (int)uVar31) {
    return 0;
  }
  if (s->is_last_block_emitted_ != 0) {
    return 0;
  }
  if (is_last != 0) {
    s->is_last_block_emitted_ = 1;
  }
  if ((ulong)(1L << ((byte)(s->params).lgblock & 0x3f)) < uVar49) {
    return 0;
  }
  m = &s->memory_manager_;
  local_a08 = (int *)CONCAT44(local_a08._4_4_,force_flush);
  wrapped_last_processed_pos = uVar47;
  bytes = uVar38;
  if ((uVar31 == 1) && (s->command_buf_ == (uint32_t *)0x0)) {
    puVar22 = (uint32_t *)duckdb_brotli::BrotliAllocate(m,0x80000);
    s->command_buf_ = puVar22;
    puVar23 = (uint8_t *)duckdb_brotli::BrotliAllocate(m,0x20000);
    s->literal_buf_ = puVar23;
  }
  auVar53 = _storage_ix;
  local_a40 = output;
  local_a00 = out_size;
  if (uVar31 < 2) {
    storage_ix._1_7_ = 0;
    storage_ix._0_1_ = s->last_bytes_bits_;
    pBStack_9b0 = auVar53._8_8_;
    puVar23 = GetBrotliStorage(s,(ulong)(uVar38 * 2 + 0x1f7));
    *puVar23 = (uint8_t)s->last_bytes_;
    puVar23[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
    uVar49 = uVar49 & 0xffffffff;
    piVar24 = GetHashTable(s,(s->params).quality,uVar49,&table_size);
    if ((s->params).quality == 0) {
      duckdb_brotli::BrotliCompressFragmentFast
                (s->one_pass_arena_,data + (uVar47 & uVar4),uVar49,is_last,piVar24,table_size,
                 &storage_ix,puVar23);
    }
    else {
      duckdb_brotli::BrotliCompressFragmentTwoPass
                (s->two_pass_arena_,data + (uVar47 & uVar4),uVar49,is_last,s->command_buf_,
                 s->literal_buf_,piVar24,table_size,&storage_ix,puVar23);
    }
    psVar32 = local_a00;
    uVar36 = storage_ix >> 3;
    s->last_bytes_ = (ushort)puVar23[uVar36];
    s->last_bytes_bits_ = (byte)storage_ix & 7;
    UpdateLastProcessedPos(s);
    *local_a40 = puVar23;
    *psVar32 = uVar36;
    return 1;
  }
  uVar36 = s->num_commands_ + (uVar49 >> 1 & 0x7fffffff) + 1;
  if (s->cmd_alloc_size_ < uVar36) {
    sVar40 = (uVar49 >> 2 & 0x3fffffff) + uVar36 + 0x10;
    s->cmd_alloc_size_ = sVar40;
    if (sVar40 == 0) {
      pCVar25 = (Command *)0x0;
    }
    else {
      pCVar25 = (Command *)duckdb_brotli::BrotliAllocate(m,sVar40 * 0x10);
    }
    if (s->commands_ != (Command *)0x0) {
      switchD_015ff80e::default(pCVar25,s->commands_,s->num_commands_ << 4);
      duckdb_brotli::BrotliFree(m,s->commands_);
      s->commands_ = (Command *)0x0;
    }
    s->commands_ = pCVar25;
  }
  hasher = &s->hasher_;
  puVar23 = (uint8_t *)(uVar49 & 0xffffffff);
  uVar31 = (uint)(is_last != 0 && uVar47 == 0);
  if ((s->hasher_).common.is_setup_ == 0) {
    local_9a8 = (undefined1  [16])0x0;
    _storage_ix = (undefined1  [16])0x0;
    pBVar1 = &(s->params).hasher;
    iVar21 = (s->params).quality;
    if (iVar21 < 10) {
      if ((iVar21 == 4) && (0xfffff < (s->params).size_hint)) {
        pBVar1->type = 0x36;
      }
      else if (iVar21 < 5) {
        pBVar1->type = iVar21;
      }
      else {
        iVar29 = (s->params).lgwin;
        if (iVar29 < 0x11) {
          iVar29 = 0x28;
          if (6 < iVar21) {
            iVar29 = (iVar21 == 9) + 0x29;
          }
          pBVar1->type = iVar29;
        }
        else {
          if ((iVar29 < 0x13) || ((s->params).size_hint < 0x100000)) {
            (s->params).hasher.type = 5;
            (s->params).hasher.block_bits = iVar21 + -1;
            iVar29 = 10;
            if (iVar21 == 9) {
              iVar29 = 0x10;
            }
            iVar30 = 4;
            if (6 < iVar21) {
              iVar30 = iVar29;
            }
            (s->params).hasher.bucket_bits = iVar21 < 7 ^ 0xf;
          }
          else {
            (s->params).hasher.type = 6;
            (s->params).hasher.bucket_bits = 0xf;
            (s->params).hasher.block_bits = iVar21 + -1;
            iVar29 = 10;
            if (iVar21 == 9) {
              iVar29 = 0x10;
            }
            iVar30 = 4;
            if (6 < iVar21) {
              iVar30 = iVar29;
            }
          }
          (s->params).hasher.num_last_distances_to_check = iVar30;
        }
      }
    }
    else {
      pBVar1->type = 10;
    }
    iVar21 = (s->params).lgwin;
    if (0x18 < iVar21) {
      if (pBVar1->type == 3) {
        pBVar1->type = 0x23;
      }
      if (pBVar1->type == 0x36) {
        pBVar1->type = 0x37;
      }
      if (pBVar1->type == 6) {
        pBVar1->type = 0x41;
      }
    }
    (s->hasher_).common.params.type = pBVar1->type;
    params = *(uint **)&(s->params).hasher.bucket_bits;
    *(uint **)&(s->hasher_).common.params.bucket_bits = params;
    (s->hasher_).common.params.num_last_distances_to_check =
         (s->params).hasher.num_last_distances_to_check;
    (s->hasher_).common.dict_num_lookups = 0;
    (s->hasher_).common.dict_num_matches = 0;
    iVar29 = (s->params).hasher.type;
    if (iVar29 < 0x23) {
      params = &switchD_01c0446e::switchdataD_01e6a178;
      switch(iVar29) {
      case 2:
      case 3:
        _storage_ix = ZEXT816(0x40000);
        break;
      case 4:
        _storage_ix = ZEXT816(0x80000);
        break;
      case 5:
      case 6:
        bVar44 = (byte)(s->params).hasher.bucket_bits;
        params = (uint *)((4L << (bVar44 & 0x3f)) << ((byte)(s->params).hasher.block_bits & 0x3f));
        pBStack_9b0 = (BrotliEncoderParams *)params;
        storage_ix = 2L << (bVar44 & 0x3f);
        break;
      case 10:
        puVar59 = (uint8_t *)(1L << ((byte)iVar21 & 0x3f));
        puVar37 = puVar23;
        if (puVar59 < puVar23) {
          puVar37 = puVar59;
        }
        if (uVar31 == 0) {
          puVar37 = puVar59;
        }
        pBStack_9b0 = (BrotliEncoderParams *)((long)puVar37 << 3);
        storage_ix = 0x80000;
      }
    }
    else if (iVar29 < 0x36) {
      switch(iVar29) {
      case 0x23:
        storage_ix = 0x40000;
LAB_01c0459e:
        pBStack_9b0 = (BrotliEncoderParams *)0x0;
        local_9a8 = ZEXT816(0x4000000);
        break;
      case 0x28:
      case 0x29:
        pBStack_9b0 = (BrotliEncoderParams *)0x40000;
        storage_ix = 0x40000;
        break;
      case 0x2a:
        pBStack_9b0 = (BrotliEncoderParams *)0x100000;
        storage_ix = 0x40000;
      }
    }
    else if (iVar29 == 0x36) {
      _storage_ix = ZEXT816(0x400000);
    }
    else {
      if (iVar29 == 0x37) {
        storage_ix = 0x400000;
        goto LAB_01c0459e;
      }
      if (iVar29 == 0x41) {
        bVar44 = (byte)(s->params).hasher.bucket_bits;
        params = (uint *)(2L << (bVar44 & 0x3f));
        pBStack_9b0 = (BrotliEncoderParams *)
                      ((4L << (bVar44 & 0x3f)) << ((byte)(s->params).hasher.block_bits & 0x3f));
        storage_ix = (size_t)params;
        local_9a8 = ZEXT816(0x4000000);
      }
    }
    lVar51 = 0;
    local_a38 = puVar23;
    do {
      if ((&storage_ix)[lVar51] != 0) {
        pvVar26 = duckdb_brotli::BrotliAllocate(m,(&storage_ix)[lVar51]);
        (s->hasher_).common.extra[lVar51] = pvVar26;
        params = &extraout_RDX->mode;
      }
      puVar23 = local_a38;
      output = local_a40;
      lVar51 = lVar51 + 1;
    } while (lVar51 != 4);
    iVar21 = (s->hasher_).common.params.type;
    if (iVar21 < 0x23) {
      switch(iVar21) {
      case 2:
      case 3:
      case 4:
switchD_01c04691_caseD_2:
        (s->hasher_).privat._H2.common = &hasher->common;
        puVar22 = (uint32_t *)(s->hasher_).common.extra[0];
LAB_01c04741:
        (s->hasher_).privat._H2.buckets_ = puVar22;
        break;
      case 5:
        duckdb_brotli::InitializeH5
                  (&hasher->common,&(s->hasher_).privat._H5,(BrotliEncoderParams *)params);
        break;
      case 6:
        (s->hasher_).privat._H6.common_ = &hasher->common;
        (s->hasher_).privat._H40.extra[0] = (void *)0x7bd3579bd3000000;
        (s->hasher_).privat._H5.bucket_size_ =
             1L << ((byte)(s->hasher_).common.params.bucket_bits & 0x3f);
        uVar5 = (s->hasher_).common.params.block_bits;
        uVar12 = (s->hasher_).common.params.num_last_distances_to_check;
        sVar40 = 1L << ((byte)uVar5 & 0x3f);
        (s->hasher_).privat._H5.block_size_ = sVar40;
        (s->hasher_).privat._H5.block_bits_ = (int)sVar40 + -1;
        *(undefined4 *)((long)&(s->hasher_).privat + 0x1c) = uVar5;
        *(undefined4 *)((long)&(s->hasher_).privat + 0x20) = uVar12;
        puVar22 = (uint32_t *)(s->hasher_).common.extra[1];
        (s->hasher_).privat._H5.buckets_ = (uint32_t *)(s->hasher_).common.extra[0];
        (s->hasher_).privat._H6.buckets_ = puVar22;
        break;
      case 10:
        (s->hasher_).privat._H2.buckets_ = (uint32_t *)(s->hasher_).common.extra[0];
        (s->hasher_).privat._H40.extra[1] = (s->hasher_).common.extra[1];
        uVar20 = -1 << ((byte)(s->params).lgwin & 0x1f);
        *(ulong *)&(s->hasher_).privat = (ulong)~uVar20;
        (s->hasher_).privat._H5.hash_shift_ = uVar20 + 1;
      }
    }
    else if (iVar21 < 0x36) {
      switch(iVar21) {
      case 0x23:
switchD_01c04632_caseD_23:
        (s->hasher_).privat._H35.common = &hasher->common;
        pHVar41 = hasher;
        ppuVar42 = &(s->hasher_).privat._H6.buckets_;
        for (lVar51 = 10; lVar51 != 0; lVar51 = lVar51 + -1) {
          *ppuVar42 = (uint32_t *)(pHVar41->common).extra[0];
          pHVar41 = (Hasher *)((long)pHVar41 + (ulong)bVar27 * -0x10 + 8);
          ppuVar42 = ppuVar42 + (ulong)bVar27 * -2 + 1;
        }
        pHVar41 = hasher;
        pHVar43 = &(s->hasher_).privat._H35.hb_common;
        for (lVar51 = 10; lVar51 != 0; lVar51 = lVar51 + -1) {
          pHVar43->extra[0] = (pHVar41->common).extra[0];
          pHVar41 = (Hasher *)((long)pHVar41 + (ulong)bVar27 * -0x10 + 8);
          pHVar43 = (HasherCommon *)((long)pHVar43 + ((ulong)bVar27 * -2 + 1) * 8);
        }
        (s->hasher_).privat._H35.fresh = 1;
        (s->hasher_).privat._H35.params = &s->params;
        break;
      case 0x28:
      case 0x29:
        (s->hasher_).privat._H5.common_ = &hasher->common;
        pvVar26 = (s->hasher_).common.extra[1];
        (s->hasher_).privat._H6.hash_mul_ = (uint64_t)(s->hasher_).common.extra[0];
        (s->hasher_).privat._H40.extra[1] = pvVar26;
        iVar21 = (s->params).quality;
        puVar22 = (uint32_t *)(ulong)((iVar21 < 7) + 7 << ((char)iVar21 - 4U & 0x1f));
        goto LAB_01c04741;
      case 0x2a:
        (s->hasher_).privat._H42.common = &hasher->common;
        pvVar26 = (s->hasher_).common.extra[1];
        (s->hasher_).privat._H42.extra[0] = (s->hasher_).common.extra[0];
        (s->hasher_).privat._H42.extra[1] = pvVar26;
        iVar21 = (s->params).quality;
        *(ulong *)((long)&(s->hasher_).privat + 0x400) =
             (ulong)((iVar21 < 7) + 7 << ((char)iVar21 - 4U & 0x1f));
      }
    }
    else {
      if (iVar21 == 0x36) goto switchD_01c04691_caseD_2;
      if (iVar21 == 0x37) goto switchD_01c04632_caseD_23;
      if (iVar21 == 0x41) {
        (s->hasher_).privat._H65.common = &hasher->common;
        pHVar41 = hasher;
        psVar32 = &(s->hasher_).privat._H35.ha_common.dict_num_matches;
        for (lVar51 = 10; lVar51 != 0; lVar51 = lVar51 + -1) {
          *psVar32 = (size_t)(pHVar41->common).extra[0];
          pHVar41 = (Hasher *)((long)pHVar41 + (ulong)bVar27 * -0x10 + 8);
          psVar32 = psVar32 + (ulong)bVar27 * -2 + 1;
        }
        pHVar41 = hasher;
        psVar32 = &(s->hasher_).privat._H35.hb_common.dict_num_matches;
        for (lVar51 = 10; lVar51 != 0; lVar51 = lVar51 + -1) {
          *psVar32 = (size_t)(pHVar41->common).extra[0];
          pHVar41 = (Hasher *)((long)pHVar41 + (ulong)bVar27 * -0x10 + 8);
          psVar32 = psVar32 + (ulong)bVar27 * -2 + 1;
        }
        (s->hasher_).privat._H65.fresh = 1;
        (s->hasher_).privat._H65.params = &s->params;
      }
    }
    (s->hasher_).common.is_prepared_ = 0;
    (s->hasher_).common.is_setup_ = 1;
  }
  puVar37 = (uint8_t *)(ulong)uVar47;
  uVar20 = (uint)puVar23;
  if ((s->hasher_).common.is_prepared_ == 0) {
    iVar21 = (s->hasher_).common.params.type;
    if (iVar21 < 0x23) {
      switch(iVar21) {
      case 2:
        puVar22 = (s->hasher_).privat._H2.buckets_;
        if ((uVar20 < 0x801) && (is_last != 0 && uVar47 == 0)) {
          if (puVar23 != (uint8_t *)0x0) {
            puVar59 = (uint8_t *)0x0;
            do {
              puVar22[(ulong)(*(long *)(data + (long)puVar59) * 0x7bd3579bd3000000) >> 0x30] = 0;
              puVar59 = puVar59 + 1;
            } while (puVar23 != puVar59);
          }
        }
        else {
          switchD_0105b559::default(puVar22,0,0x40000);
        }
        break;
      case 3:
        duckdb_brotli::PrepareH3(&(s->hasher_).privat._H3,uVar31,(size_t)puVar23,data);
        break;
      case 4:
        duckdb_brotli::PrepareH4(&(s->hasher_).privat._H4,uVar31,(size_t)puVar23,data);
        break;
      case 5:
        duckdb_brotli::PrepareH5(&(s->hasher_).privat._H5,uVar31,(size_t)puVar23,data);
        break;
      case 6:
        duckdb_brotli::PrepareH6(&(s->hasher_).privat._H6,uVar31,(size_t)puVar23,data);
        break;
      case 10:
        puVar22 = (s->hasher_).privat._H2.buckets_;
        uVar38 = (s->hasher_).privat._H5.hash_shift_;
        lVar51 = 0;
        do {
          puVar6 = puVar22 + lVar51;
          *puVar6 = uVar38;
          puVar6[1] = uVar38;
          puVar6[2] = uVar38;
          puVar6[3] = uVar38;
          lVar51 = lVar51 + 4;
        } while (lVar51 != 0x20000);
      }
    }
    else if (iVar21 < 0x36) {
      switch(iVar21) {
      case 0x23:
        duckdb_brotli::PrepareH35(&(s->hasher_).privat._H35,uVar31,(size_t)puVar23,data);
        break;
      case 0x28:
        duckdb_brotli::PrepareH40(&(s->hasher_).privat._H40,uVar31,(size_t)puVar23,data);
        break;
      case 0x29:
        duckdb_brotli::PrepareH41(&(s->hasher_).privat._H41,uVar31,(size_t)puVar23,data);
        break;
      case 0x2a:
        duckdb_brotli::PrepareH42(&(s->hasher_).privat._H42,uVar31,(size_t)puVar23,data);
      }
    }
    else if (iVar21 == 0x36) {
      duckdb_brotli::PrepareH54(&(s->hasher_).privat._H54,uVar31,(size_t)puVar23,data);
    }
    else if (iVar21 == 0x37) {
      duckdb_brotli::PrepareH55(&(s->hasher_).privat._H55,uVar31,(size_t)puVar23,data);
    }
    else if (iVar21 == 0x41) {
      duckdb_brotli::PrepareH65(&(s->hasher_).privat._H65,uVar31,(size_t)puVar23,data);
    }
    (s->hasher_).common.is_prepared_ = 1;
  }
  iVar21 = (s->hasher_).common.params.type;
  if (iVar21 < 0x23) {
    switch(iVar21) {
    case 2:
      if ((6 < uVar20) && (2 < uVar47)) {
        puVar22 = (s->hasher_).privat._H2.buckets_;
        puVar22[(ulong)(*(long *)(data + (uVar47 - 3 & uVar4)) * 0x7bd3579bd3000000) >> 0x30] =
             uVar47 - 3;
        puVar22[(ulong)(*(long *)(data + (uVar47 - 2 & uVar4)) * 0x7bd3579bd3000000) >> 0x30] =
             uVar47 - 2;
        puVar22[(ulong)(*(long *)(data + (uVar47 - 1 & uVar4)) * 0x7bd3579bd3000000) >> 0x30] =
             uVar47 - 1;
      }
      break;
    case 3:
      if ((6 < uVar20) && (2 < uVar47)) {
        uVar31 = uVar47 - 3;
        puVar22 = (s->hasher_).privat._H2.buckets_;
        uVar20 = 0xffff;
        puVar22[(uint)(ushort)((ulong)(*(long *)(data + (uVar31 & uVar4)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar31 & 8) & 0xffff] = uVar31;
        uVar31 = uVar47 - 2;
        puVar22[(uint)(ushort)((ulong)(*(long *)(data + (uVar31 & uVar4)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar31 & 8) & 0xffff] = uVar31;
        uVar31 = (uint)(ushort)((ulong)(*(long *)(data + (uVar47 - 1 & uVar4)) * 0x7bd3579bd3000000)
                               >> 0x30);
        uVar39 = uVar47 - 1 & 8;
LAB_01c05869:
        puVar22[uVar31 + uVar39 & uVar20] = uVar47 - 1;
      }
      break;
    case 4:
      if ((6 < uVar20) && (2 < uVar47)) {
        uVar31 = uVar47 - 3;
        puVar22 = (s->hasher_).privat._H2.buckets_;
        uVar20 = 0x1ffff;
        puVar22[(uint)((ulong)(*(long *)(data + (uVar31 & uVar4)) * 0x7bd3579bd3000000) >> 0x2f) +
                (uVar31 & 0x18) & 0x1ffff] = uVar31;
        uVar31 = uVar47 - 2;
        puVar22[(uint)((ulong)(*(long *)(data + (uVar31 & uVar4)) * 0x7bd3579bd3000000) >> 0x2f) +
                (uVar31 & 0x18) & 0x1ffff] = uVar31;
        uVar31 = (uint)((ulong)(*(long *)(data + (uVar47 - 1 & uVar4)) * 0x7bd3579bd3000000) >> 0x2f
                       );
LAB_01c05863:
        uVar39 = uVar47 - 1 & 0x18;
        goto LAB_01c05869;
      }
      break;
    case 5:
      if ((2 < uVar20) && (2 < uVar47)) {
        uVar31 = (uint)(*(int *)(data + (uVar47 - 3 & uVar4)) * 0x1e35a7bd) >>
                 (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
        puVar8 = (s->hasher_).privat._H5.num_;
        uVar19 = puVar8[uVar31];
        puVar22 = (s->hasher_).privat._H5.buckets_;
        puVar22[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar19) +
                (ulong)(uVar31 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] =
             uVar47 - 3;
        puVar8[uVar31] = uVar19 + 1;
        uVar31 = (uint)(*(int *)(data + (uVar47 - 2 & uVar4)) * 0x1e35a7bd) >>
                 (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
        uVar19 = puVar8[uVar31];
        puVar22[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar19) +
                (ulong)(uVar31 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] =
             uVar47 - 2;
        puVar8[uVar31] = uVar19 + 1;
        uVar31 = (uint)(*(int *)(data + (uVar47 - 1 & uVar4)) * 0x1e35a7bd) >>
                 (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
        uVar19 = puVar8[uVar31];
        puVar22[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar19) +
                (ulong)(uVar31 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] =
             uVar47 - 1;
        puVar8[uVar31] = uVar19 + 1;
      }
      break;
    case 6:
      if ((6 < uVar20) && (2 < uVar47)) {
        puVar22 = (s->hasher_).privat._H5.buckets_;
        puVar6 = (s->hasher_).privat._H6.buckets_;
        uVar10 = (s->hasher_).privat._H6.hash_mul_;
        uVar36 = *(long *)(data + (uVar47 - 3 & uVar4)) * uVar10 >> 0x31;
        uVar19 = *(ushort *)((long)puVar22 + uVar36 * 2);
        uVar31 = (s->hasher_).privat._H6.block_mask_;
        bVar27 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
        *(ushort *)((long)puVar22 + uVar36 * 2) = uVar19 + 1;
        puVar6[(uVar36 << (bVar27 & 0x3f)) + (ulong)(uVar31 & uVar19)] = uVar47 - 3;
        uVar36 = *(long *)(data + (uVar47 - 2 & uVar4)) * uVar10 >> 0x31;
        uVar19 = *(ushort *)((long)puVar22 + uVar36 * 2);
        uVar31 = (s->hasher_).privat._H6.block_mask_;
        bVar27 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
        *(ushort *)((long)puVar22 + uVar36 * 2) = uVar19 + 1;
        puVar6[(uVar36 << (bVar27 & 0x3f)) + (ulong)(uVar31 & uVar19)] = uVar47 - 2;
        uVar36 = uVar10 * *(long *)(data + (uVar47 - 1 & uVar4)) >> 0x31;
        uVar19 = *(ushort *)((long)puVar22 + uVar36 * 2);
        uVar31 = (s->hasher_).privat._H6.block_mask_;
        bVar27 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
        *(ushort *)((long)puVar22 + uVar36 * 2) = uVar19 + 1;
        puVar6[(uVar36 << (bVar27 & 0x3f)) + (ulong)(uVar31 & uVar19)] = uVar47 - 1;
      }
      break;
    case 10:
      if ((2 < uVar20) && (0x7f < uVar47)) {
        puVar59 = puVar37 + -0x7f;
        local_9d8 = puVar23 + (long)(puVar37 + -0x7f);
        if (puVar37 < puVar23 + (long)(puVar37 + -0x7f)) {
          local_9d8 = puVar37;
        }
        local_9e8 = (double)(s->hasher_).privat._H5.bucket_size_;
        local_a20 = (int *)(s->hasher_).privat._H2.buckets_;
        pvVar26 = (s->hasher_).privat._H40.extra[1];
        do {
          uVar36 = (long)puVar37 - (long)puVar59;
          if (uVar36 < 0x10) {
            uVar36 = 0xf;
          }
          local_a18 = (uint8_t *)((long)local_9e8 - uVar36);
          uVar47 = (uint)puVar59 & uVar4;
          local_a38 = data + uVar47;
          uVar47 = (uint)(*(int *)(data + uVar47) * 0x1e35a7bd) >> 0xf;
          puVar23 = (uint8_t *)(ulong)((uint32_t *)local_a20)[uVar47];
          uVar36 = ((ulong)local_9e8 & (ulong)puVar59) * 2 + 1;
          uVar49 = ((ulong)local_9e8 & (ulong)puVar59) * 2;
          ((uint32_t *)local_a20)[uVar47] = (uint)puVar59;
          lVar51 = 0x40;
          local_9f8 = (size_t *)0x0;
          local_a60 = (uint8_t *)0x0;
          do {
            if ((puVar59 == puVar23) || (lVar51 == 0 || local_a18 < puVar59 + -(long)puVar23)) {
              *(int *)((long)pvVar26 + uVar49 * 4) = (s->hasher_).privat._H5.hash_shift_;
              *(int *)((long)pvVar26 + uVar36 * 4) = (s->hasher_).privat._H5.hash_shift_;
              bVar52 = false;
            }
            else {
              uVar47 = (uint)puVar23;
              psVar32 = (size_t *)local_a60;
              if (local_9f8 < local_a60) {
                psVar32 = local_9f8;
              }
              puVar2 = (ulong *)(local_a38 + (long)psVar32);
              puVar45 = (ulong *)(data + (long)((long)psVar32 + (ulong)(uVar47 & uVar4)));
              puVar35 = local_a18;
              puVar33 = puVar2;
              for (uVar46 = 0x80 - (long)psVar32; 7 < uVar46; uVar46 = uVar46 - 8) {
                uVar50 = *puVar45;
                uVar7 = *puVar33;
                if (uVar50 == uVar7) {
                  puVar33 = puVar33 + 1;
                }
                else {
                  uVar13 = 0;
                  if ((uVar7 ^ uVar50) != 0) {
                    for (; ((uVar7 ^ uVar50) >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  puVar35 = (uint8_t *)((long)puVar33 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar2))
                  ;
                }
                if (uVar50 != uVar7) goto LAB_01c0530b;
                puVar45 = puVar45 + 1;
              }
              puVar34 = puVar33;
              if (uVar46 != 0) {
                puVar34 = (ulong *)((long)puVar33 + uVar46);
                uVar50 = 0;
                do {
                  if (*(uint8_t *)((long)puVar33 + uVar50) != *(uint8_t *)((long)puVar45 + uVar50))
                  {
                    puVar34 = (ulong *)((long)puVar33 + uVar50);
                    break;
                  }
                  uVar50 = uVar50 + 1;
                } while (uVar46 != uVar50);
              }
              puVar35 = (uint8_t *)((long)puVar34 - (long)puVar2);
LAB_01c0530b:
              puVar35 = puVar35 + (long)psVar32;
              output = local_a40;
              if (puVar35 < (uint8_t *)0x80) {
                uVar46 = ((ulong)puVar23 & (ulong)local_9e8) * 2;
                if (data[(long)(puVar35 + (uVar47 & uVar4))] < local_a38[(long)puVar35]) {
                  *(uint *)((long)pvVar26 + uVar49 * 4) = uVar47;
                  uVar46 = uVar46 | 1;
                  uVar49 = uVar46;
                  local_9f8 = (size_t *)puVar35;
                }
                else {
                  *(uint *)((long)pvVar26 + uVar36 * 4) = uVar47;
                  uVar36 = uVar46;
                  local_a60 = puVar35;
                }
                puVar23 = (uint8_t *)(ulong)*(uint *)((long)pvVar26 + uVar46 * 4);
                bVar52 = true;
              }
              else {
                *(undefined4 *)((long)pvVar26 + uVar49 * 4) =
                     *(undefined4 *)((long)pvVar26 + ((ulong)puVar23 & (ulong)local_9e8) * 8);
                *(undefined4 *)((long)pvVar26 + uVar36 * 4) =
                     *(undefined4 *)((long)pvVar26 + ((ulong)puVar23 & (ulong)local_9e8) * 8 + 4);
                bVar52 = false;
              }
            }
            lVar51 = lVar51 + -1;
          } while (bVar52);
          puVar59 = puVar59 + 1;
        } while (puVar59 < local_9d8);
      }
    }
  }
  else if (iVar21 < 0x36) {
    switch(iVar21) {
    case 0x23:
      if ((6 < uVar20) && (2 < uVar47)) {
        uVar31 = uVar47 - 3;
        puVar22 = (s->hasher_).privat._H2.buckets_;
        puVar22[(uint)(ushort)((ulong)(*(long *)(data + (uVar31 & uVar4)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar31 & 8) & 0xffff] = uVar31;
        uVar31 = uVar47 - 2;
        puVar22[(uint)(ushort)((ulong)(*(long *)(data + (uVar31 & uVar4)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar31 & 8) & 0xffff] = uVar31;
        uVar31 = uVar47 - 1;
        puVar22[(uint)(ushort)((ulong)(*(long *)(data + (uVar31 & uVar4)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar31 & 8) & 0xffff] = uVar31;
      }
      if ((uVar47 & 3) != 0) {
        puVar59 = (uint8_t *)(4 - ((ulong)puVar37 & 3));
        bVar52 = puVar23 < puVar59;
        puVar23 = puVar23 + -(long)puVar59;
        if (bVar52) {
          puVar23 = (uint8_t *)0x0;
        }
        puVar37 = puVar37 + (long)puVar59;
      }
      uVar36 = (ulong)((uint)puVar37 & uVar4);
      puVar59 = (uint8_t *)(mask - uVar36);
      if (puVar23 < puVar59) {
        puVar59 = puVar23;
      }
      if ((uint8_t *)0x1f < puVar59) {
        (s->hasher_).privat._H5.hash_shift_ = 0;
        iVar21 = 0;
        uVar49 = 0xfffffffffffffffc;
        do {
          iVar21 = iVar21 * (s->hasher_).privat._H35.hb.factor + (uint)data[uVar49 + uVar36 + 4] + 1
          ;
          uVar49 = uVar49 + 4;
        } while (uVar49 < 0x1c);
LAB_01c0598f:
        (s->hasher_).privat._H5.hash_shift_ = iVar21;
      }
LAB_01c0599a:
      *(uint8_t **)&(s->hasher_).privat._H65.ha.num_last_distances_to_check_ = puVar37;
      break;
    case 0x28:
    case 0x29:
      if ((2 < uVar20) && (2 < uVar47)) {
        puVar23 = puVar37 + -3;
        pvVar26 = (s->hasher_).privat._H40.extra[0];
        pvVar9 = (s->hasher_).privat._H40.extra[1];
        uVar47 = (uint)(*(int *)(data + ((uint)puVar23 & uVar4)) * 0x1e35a7bd) >> 0x11;
        uVar36 = (ulong)uVar47;
        uVar19 = (s->hasher_).privat._H42.free_slot_idx[0];
        (s->hasher_).privat._H42.free_slot_idx[0] = uVar19 + 1;
        uVar49 = (long)puVar23 - (ulong)*(uint *)((long)pvVar26 + uVar36 * 4);
        if (0xfffe < uVar49) {
          uVar49 = 0xffff;
        }
        *(char *)((long)pvVar26 + ((ulong)puVar23 & 0xffff) + 0x30000) = (char)uVar47;
        *(short *)((long)pvVar9 + (ulong)uVar19 * 4) = (short)uVar49;
        *(undefined2 *)((long)pvVar9 + (ulong)uVar19 * 4 + 2) =
             *(undefined2 *)((long)pvVar26 + uVar36 * 2 + 0x20000);
        *(uint *)((long)pvVar26 + uVar36 * 4) = (uint)puVar23;
        *(ushort *)((long)pvVar26 + uVar36 * 2 + 0x20000) = uVar19;
        puVar23 = puVar37 + -2;
        pvVar26 = (s->hasher_).privat._H40.extra[0];
        pvVar9 = (s->hasher_).privat._H40.extra[1];
        uVar47 = (uint)(*(int *)(data + ((uint)puVar23 & uVar4)) * 0x1e35a7bd) >> 0x11;
        uVar36 = (ulong)uVar47;
        uVar19 = (s->hasher_).privat._H42.free_slot_idx[0];
        (s->hasher_).privat._H42.free_slot_idx[0] = uVar19 + 1;
        uVar49 = (long)puVar23 - (ulong)*(uint *)((long)pvVar26 + uVar36 * 4);
        *(char *)((long)pvVar26 + ((ulong)puVar23 & 0xffff) + 0x30000) = (char)uVar47;
        if (0xfffe < uVar49) {
          uVar49 = 0xffff;
        }
        *(short *)((long)pvVar9 + (ulong)uVar19 * 4) = (short)uVar49;
        *(undefined2 *)((long)pvVar9 + (ulong)uVar19 * 4 + 2) =
             *(undefined2 *)((long)pvVar26 + uVar36 * 2 + 0x20000);
        *(uint *)((long)pvVar26 + uVar36 * 4) = (uint)puVar23;
        *(ushort *)((long)pvVar26 + uVar36 * 2 + 0x20000) = uVar19;
        puVar37 = puVar37 + -1;
        pvVar26 = (s->hasher_).privat._H40.extra[0];
        pvVar9 = (s->hasher_).privat._H40.extra[1];
        uVar47 = (uint)(*(int *)(data + ((uint)puVar37 & uVar4)) * 0x1e35a7bd) >> 0x11;
        uVar36 = (ulong)uVar47;
        uVar19 = (s->hasher_).privat._H42.free_slot_idx[0];
        (s->hasher_).privat._H42.free_slot_idx[0] = uVar19 + 1;
        uVar49 = (long)puVar37 - (ulong)*(uint *)((long)pvVar26 + uVar36 * 4);
        *(char *)((long)pvVar26 + ((ulong)puVar37 & 0xffff) + 0x30000) = (char)uVar47;
        if (0xfffe < uVar49) {
          uVar49 = 0xffff;
        }
        *(short *)((long)pvVar9 + (ulong)uVar19 * 4) = (short)uVar49;
        *(undefined2 *)((long)pvVar9 + (ulong)uVar19 * 4 + 2) =
             *(undefined2 *)((long)pvVar26 + uVar36 * 2 + 0x20000);
        *(uint *)((long)pvVar26 + uVar36 * 4) = (uint)puVar37;
        *(ushort *)((long)pvVar26 + uVar36 * 2 + 0x20000) = uVar19;
      }
      break;
    case 0x2a:
      if ((2 < uVar20) && (2 < uVar47)) {
        puVar23 = puVar37 + -3;
        pvVar26 = (s->hasher_).privat._H42.extra[0];
        uVar31 = (uint)(*(int *)(data + ((uint)puVar23 & uVar4)) * 0x1e35a7bd) >> 0x11;
        uVar36 = (ulong)uVar31;
        uVar47 = uVar31 & 0x1ff;
        uVar19 = *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar47 * 2);
        pvVar9 = (s->hasher_).privat._H42.extra[1];
        *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar47 * 2) = uVar19 + 1;
        uVar49 = (ulong)uVar19 & 0x1ff;
        uVar46 = (long)puVar23 - (ulong)*(uint *)((long)pvVar26 + uVar36 * 4);
        *(char *)((long)pvVar26 + ((ulong)puVar23 & 0xffff) + 0x30000) = (char)uVar31;
        if (0xfffe < uVar46) {
          uVar46 = 0xffff;
        }
        *(short *)((long)pvVar9 + uVar49 * 4 + (ulong)(uVar47 << 0xb)) = (short)uVar46;
        *(undefined2 *)((long)pvVar9 + uVar49 * 4 + (ulong)(uVar47 << 0xb) + 2) =
             *(undefined2 *)((long)pvVar26 + uVar36 * 2 + 0x20000);
        *(uint *)((long)pvVar26 + uVar36 * 4) = (uint)puVar23;
        *(short *)((long)pvVar26 + uVar36 * 2 + 0x20000) = (short)uVar49;
        puVar23 = puVar37 + -2;
        pvVar26 = (s->hasher_).privat._H42.extra[0];
        uVar47 = (uint)(*(int *)(data + ((uint)puVar23 & uVar4)) * 0x1e35a7bd) >> 0x11;
        uVar36 = (ulong)uVar47;
        uVar31 = uVar47 & 0x1ff;
        uVar19 = *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar31 * 2);
        pvVar9 = (s->hasher_).privat._H42.extra[1];
        *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar31 * 2) = uVar19 + 1;
        uVar49 = (ulong)uVar19 & 0x1ff;
        uVar46 = (long)puVar23 - (ulong)*(uint *)((long)pvVar26 + uVar36 * 4);
        *(char *)((long)pvVar26 + ((ulong)puVar23 & 0xffff) + 0x30000) = (char)uVar47;
        if (0xfffe < uVar46) {
          uVar46 = 0xffff;
        }
        *(short *)((long)pvVar9 + uVar49 * 4 + (ulong)(uVar31 << 0xb)) = (short)uVar46;
        *(undefined2 *)((long)pvVar9 + uVar49 * 4 + (ulong)(uVar31 << 0xb) + 2) =
             *(undefined2 *)((long)pvVar26 + uVar36 * 2 + 0x20000);
        *(uint *)((long)pvVar26 + uVar36 * 4) = (uint)puVar23;
        *(short *)((long)pvVar26 + uVar36 * 2 + 0x20000) = (short)uVar49;
        puVar37 = puVar37 + -1;
        pvVar26 = (s->hasher_).privat._H42.extra[0];
        uVar31 = (uint)(*(int *)(data + ((uint)puVar37 & uVar4)) * 0x1e35a7bd) >> 0x11;
        uVar49 = (ulong)uVar31;
        uVar47 = uVar31 & 0x1ff;
        uVar19 = *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar47 * 2);
        pvVar9 = (s->hasher_).privat._H42.extra[1];
        *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar47 * 2) = uVar19 + 1;
        uVar46 = (ulong)uVar19 & 0x1ff;
        uVar36 = (long)puVar37 - (ulong)*(uint *)((long)pvVar26 + uVar49 * 4);
        *(char *)((long)pvVar26 + ((ulong)puVar37 & 0xffff) + 0x30000) = (char)uVar31;
        if (0xfffe < uVar36) {
          uVar36 = 0xffff;
        }
        *(short *)((long)pvVar9 + uVar46 * 4 + (ulong)(uVar47 << 0xb)) = (short)uVar36;
        *(undefined2 *)((long)pvVar9 + uVar46 * 4 + (ulong)(uVar47 << 0xb) + 2) =
             *(undefined2 *)((long)pvVar26 + uVar49 * 2 + 0x20000);
        *(uint *)((long)pvVar26 + uVar49 * 4) = (uint)puVar37;
        *(short *)((long)pvVar26 + uVar49 * 2 + 0x20000) = (short)uVar46;
      }
    }
  }
  else if (iVar21 == 0x36) {
    if ((6 < uVar20) && (2 < uVar47)) {
      uVar31 = uVar47 - 3;
      puVar22 = (s->hasher_).privat._H2.buckets_;
      uVar20 = 0xfffff;
      puVar22[(uint)((ulong)(*(long *)(data + (uVar31 & uVar4)) * -0x1ca5842ca8642d00) >> 0x2c) +
              (uVar31 & 0x18) & 0xfffff] = uVar31;
      uVar31 = uVar47 - 2;
      puVar22[(uint)((ulong)(*(long *)(data + (uVar31 & uVar4)) * -0x1ca5842ca8642d00) >> 0x2c) +
              (uVar31 & 0x18) & 0xfffff] = uVar31;
      uVar31 = (uint)((ulong)(*(long *)(data + (uVar47 - 1 & uVar4)) * -0x1ca5842ca8642d00) >> 0x2c)
      ;
      goto LAB_01c05863;
    }
  }
  else {
    if (iVar21 == 0x37) {
      if ((6 < uVar20) && (2 < uVar47)) {
        uVar31 = uVar47 - 3;
        puVar22 = (s->hasher_).privat._H2.buckets_;
        puVar22[(uint)((ulong)(*(long *)(data + (uVar31 & uVar4)) * -0x1ca5842ca8642d00) >> 0x2c) +
                (uVar31 & 0x18) & 0xfffff] = uVar31;
        uVar31 = uVar47 - 2;
        puVar22[(uint)((ulong)(*(long *)(data + (uVar31 & uVar4)) * -0x1ca5842ca8642d00) >> 0x2c) +
                (uVar31 & 0x18) & 0xfffff] = uVar31;
        uVar31 = uVar47 - 1;
        puVar22[(uint)((ulong)(*(long *)(data + (uVar31 & uVar4)) * -0x1ca5842ca8642d00) >> 0x2c) +
                (uVar31 & 0x18) & 0xfffff] = uVar31;
      }
      if ((uVar47 & 3) != 0) {
        puVar59 = (uint8_t *)(4 - ((ulong)puVar37 & 3));
        bVar52 = puVar23 < puVar59;
        puVar23 = puVar23 + -(long)puVar59;
        if (bVar52) {
          puVar23 = (uint8_t *)0x0;
        }
        puVar37 = puVar37 + (long)puVar59;
      }
      uVar36 = (ulong)((uint)puVar37 & uVar4);
      puVar59 = (uint8_t *)(mask - uVar36);
      if (puVar23 < puVar59) {
        puVar59 = puVar23;
      }
      if ((uint8_t *)0x1f < puVar59) {
        (s->hasher_).privat._H5.hash_shift_ = 0;
        iVar21 = 0;
        uVar49 = 0xfffffffffffffffc;
        do {
          iVar21 = iVar21 * (s->hasher_).privat._H35.hb.factor + (uint)data[uVar49 + uVar36 + 4] + 1
          ;
          uVar49 = uVar49 + 4;
        } while (uVar49 < 0x1c);
        goto LAB_01c0598f;
      }
      goto LAB_01c0599a;
    }
    if (iVar21 == 0x41) {
      if ((6 < uVar20) && (2 < uVar47)) {
        puVar22 = (s->hasher_).privat._H5.buckets_;
        puVar6 = (s->hasher_).privat._H6.buckets_;
        uVar10 = (s->hasher_).privat._H6.hash_mul_;
        uVar36 = *(long *)(data + (uVar47 - 3 & uVar4)) * uVar10 >> 0x31;
        uVar19 = *(ushort *)((long)puVar22 + uVar36 * 2);
        uVar31 = (s->hasher_).privat._H6.block_mask_;
        bVar27 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
        *(ushort *)((long)puVar22 + uVar36 * 2) = uVar19 + 1;
        puVar6[(uVar36 << (bVar27 & 0x3f)) + (ulong)(uVar31 & uVar19)] = uVar47 - 3;
        uVar36 = *(long *)(data + (uVar47 - 2 & uVar4)) * uVar10 >> 0x31;
        uVar19 = *(ushort *)((long)puVar22 + uVar36 * 2);
        uVar31 = (s->hasher_).privat._H6.block_mask_;
        bVar27 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
        *(ushort *)((long)puVar22 + uVar36 * 2) = uVar19 + 1;
        puVar6[(uVar36 << (bVar27 & 0x3f)) + (ulong)(uVar31 & uVar19)] = uVar47 - 2;
        uVar36 = uVar10 * *(long *)(data + (uVar47 - 1 & uVar4)) >> 0x31;
        uVar19 = *(ushort *)((long)puVar22 + uVar36 * 2);
        uVar31 = (s->hasher_).privat._H6.block_mask_;
        bVar27 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
        *(ushort *)((long)puVar22 + uVar36 * 2) = uVar19 + 1;
        puVar6[(uVar36 << (bVar27 & 0x3f)) + (ulong)(uVar31 & uVar19)] = uVar47 - 1;
      }
      puVar59 = (uint8_t *)(mask - (uVar4 & uVar47));
      if (puVar23 <= puVar59) {
        puVar59 = puVar23;
      }
      if (0x1f < (uint)puVar59) {
        (s->hasher_).privat._H65.hb.state = 0;
        lVar51 = 0;
        uVar38 = 0;
        do {
          uVar38 = uVar38 * (s->hasher_).privat._H65.hb.factor +
                   (uint)data[lVar51 + (ulong)(uVar4 & uVar47)] + 1;
          lVar51 = lVar51 + 1;
        } while (lVar51 != 0x20);
        (s->hasher_).privat._H65.hb.state = uVar38;
      }
      (s->hasher_).privat._H35.ha_common.extra[3] = puVar37;
    }
  }
  uVar36 = s->last_flush_pos_;
  uVar47 = (uint)uVar36;
  if (0xbfffffff < uVar36) {
    uVar47 = ((int)(uVar47 * 2) >> 1 & 0xc0000000U) + (uVar47 & 0x3fffffff) + 0x80000000;
  }
  psVar32 = &s->num_commands_;
  if (((s->params).quality < 10) ||
     (iVar21 = duckdb_brotli::BrotliIsMostlyUTF8
                         (data,(ulong)uVar47,mask,s->input_pos_ - uVar36,0.75), iVar21 != 0)) {
    literal_context_mode = CONTEXT_UTF8;
  }
  else {
    literal_context_mode = CONTEXT_SIGNED;
  }
  if ((*psVar32 != 0) && (s->last_insert_len_ == 0)) {
    ExtendLastCommand(s,&bytes,&wrapped_last_processed_pos);
  }
  local_9d8 = &duckdb_brotli::_kBrotliContextLookupTable + (literal_context_mode << 9);
  iVar21 = (s->params).quality;
  uVar49 = (ulong)bytes;
  uVar36 = (ulong)wrapped_last_processed_pos;
  piVar24 = s->dist_cache_;
  last_insert_len = &s->last_insert_len_;
  pCVar25 = s->commands_ + s->num_commands_;
  num_literals = &s->num_literals_;
  if (iVar21 == 0xb) {
    duckdb_brotli::BrotliCreateHqZopfliBackwardReferences
              (m,uVar49,uVar36,data,mask,local_9d8,&s->params,hasher,piVar24,last_insert_len,pCVar25
               ,psVar32,num_literals);
  }
  else if (iVar21 == 10) {
    duckdb_brotli::BrotliCreateZopfliBackwardReferences
              (m,uVar49,uVar36,data,mask,local_9d8,&s->params,hasher,piVar24,last_insert_len,pCVar25
               ,psVar32,num_literals);
  }
  else {
    duckdb_brotli::BrotliCreateBackwardReferences
              (uVar49,uVar36,data,mask,local_9d8,&s->params,hasher,piVar24,last_insert_len,pCVar25,
               psVar32,num_literals);
  }
  iVar21 = (s->params).lgwin;
  iVar29 = (s->params).lgblock;
  if (iVar21 <= iVar29) {
    iVar21 = iVar29;
  }
  cVar28 = '\x17';
  if (iVar21 < 0x17) {
    cVar28 = (char)iVar21;
  }
  uVar36 = 1L << (cVar28 + 1U & 0x3f);
  uVar10 = s->input_pos_;
  uVar11 = s->last_flush_pos_;
  if ((s->params).quality < 4) {
    bVar52 = 0x2ffe < s->num_commands_ + s->num_literals_;
  }
  else {
    bVar52 = false;
  }
  uVar49 = uVar10 - uVar11;
  local_9f8 = psVar32;
  if (((((int)local_a08 == 0 && is_last == 0) && (!bVar52)) &&
      ((1L << ((byte)iVar29 & 0x3f)) + uVar49 <= uVar36)) &&
     ((uVar36 = uVar36 >> 3, s->num_literals_ < uVar36 && (*psVar32 < uVar36)))) {
    iVar21 = UpdateLastProcessedPos(s);
    if (iVar21 != 0) {
      (s->hasher_).common.is_prepared_ = 0;
    }
LAB_01c05d2c:
    *local_a00 = 0;
    return 1;
  }
  uVar36 = s->last_insert_len_;
  if (uVar36 != 0) {
    pCVar25 = s->commands_;
    sVar40 = s->num_commands_;
    s->num_commands_ = sVar40 + 1;
    pCVar25[sVar40].insert_len_ = (uint32_t)uVar36;
    pCVar25[sVar40].copy_len_ = 0x8000000;
    pCVar25[sVar40].dist_extra_ = 0;
    pCVar25[sVar40].dist_prefix_ = 0x10;
    if (uVar36 < 6) {
      uVar46 = uVar36 & 0xffffffff;
    }
    else if (uVar36 < 0x82) {
      uVar47 = 0x1f;
      uVar31 = (uint)(uVar36 - 2);
      if (uVar31 != 0) {
        for (; uVar31 >> uVar47 == 0; uVar47 = uVar47 - 1) {
        }
      }
      uVar46 = (ulong)((int)(uVar36 - 2 >> ((char)(uVar47 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar47 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar36 < 0x842) {
      uVar31 = (uint32_t)uVar36 - 0x42;
      uVar47 = 0x1f;
      if (uVar31 != 0) {
        for (; uVar31 >> uVar47 == 0; uVar47 = uVar47 - 1) {
        }
      }
      uVar46 = (ulong)((uVar47 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar46 = 0x15;
      if (0x1841 < uVar36) {
        uVar46 = (ulong)(ushort)(0x17 - (uVar36 < 0x5842));
      }
    }
    iVar21 = (int)((uVar46 & 0xffff) >> 3) * 3;
    pCVar25[sVar40].cmd_prefix_ =
         ((ushort)(0x520d40 >> ((char)iVar21 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar21 * 0x40 +
         ((ushort)uVar46 & 7) * 8 + 0x42;
    s->num_literals_ = s->num_literals_ + uVar36;
    s->last_insert_len_ = 0;
  }
  if (uVar10 == uVar11 && is_last == 0) goto LAB_01c05d2c;
  puVar23 = GetBrotliStorage(s,(ulong)((uint)uVar49 * 2 + 0x1f7));
  storage_ix_1 = (size_t)s->last_bytes_bits_;
  *puVar23 = (uint8_t)s->last_bytes_;
  puVar23[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  uVar36 = s->last_flush_pos_;
  uVar46 = uVar49 & 0xffffffff;
  uVar47 = (uint)uVar36;
  if (0xbfffffff < uVar36) {
    uVar47 = (uVar47 & 0x3fffffff) + ((int)(uVar47 * 2) >> 1 & 0xc0000000U) + 0x80000000;
  }
  bVar27 = s->prev_byte_;
  bVar44 = s->prev_byte2_;
  sVar40 = s->num_literals_;
  local_a10 = s->commands_;
  local_a28 = s->num_commands_;
  local_a08 = s->saved_dist_cache_;
  switchD_015ff80e::default(&storage_ix,s,0x578);
  local_a20 = piVar24;
  if (uVar46 == 0) {
    *(ulong *)(puVar23 + (storage_ix_1 >> 3)) =
         3L << ((byte)storage_ix_1 & 7) | (ulong)puVar23[storage_ix_1 >> 3];
    storage_ix_1 = (size_t)((int)storage_ix_1 + 9U & 0xfffffff8);
    piVar24 = local_a08;
    goto LAB_01c064e7;
  }
  uVar50 = uVar46;
  if ((uint)uVar49 < 3) {
LAB_01c05e18:
    uVar14 = *(undefined8 *)(local_a08 + 2);
    *(undefined8 *)piVar24 = *(undefined8 *)local_a08;
    *(undefined8 *)(piVar24 + 2) = uVar14;
  }
  else {
    if ((local_a28 < (uVar49 >> 8 & 0xffffff) + 2) &&
       (auVar53._8_4_ = (int)(sVar40 >> 0x20), auVar53._0_8_ = sVar40, auVar53._12_4_ = 0x45300000,
       (double)uVar46 * 0.99 <
       (auVar53._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar40) - 4503599627370496.0))) {
      switchD_0105b559::default(&table_size,0,0x400);
      uVar49 = (uVar46 + 0xc) / 0xd;
      do {
        auStack_430[(ulong)data[(uint)uVar36 & uVar4] - 2] =
             auStack_430[(ulong)data[(uint)uVar36 & uVar4] - 2] + 1;
        uVar36 = (ulong)((uint)uVar36 + 0xd);
        uVar49 = uVar49 - 1;
      } while (uVar49 != 0);
      dVar56 = 0.0;
      uVar36 = 0xfffffffffffffff8;
      puVar37 = (uint8_t *)0x0;
      local_9c0 = uVar46;
      do {
        uVar49 = (ulong)*(uint *)((long)auStack_430 + uVar36);
        local_a38 = (uint8_t *)(double)uVar49;
        if (uVar49 < 0x100) {
          dVar58 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar49];
        }
        else {
          dVar58 = log2((double)local_a38);
        }
        uVar50 = (ulong)*(uint *)((long)auStack_430 + uVar36 + 4);
        puVar59 = (uint8_t *)(double)uVar50;
        if (uVar50 < 0x100) {
          dVar55 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar50];
        }
        else {
          local_a18 = puVar59;
          local_9e8 = dVar58;
          dVar55 = log2((double)puVar59);
          dVar58 = local_9e8;
          puVar59 = local_a18;
        }
        piVar24 = local_a20;
        output = local_a40;
        puVar37 = puVar37 + uVar50 + uVar49;
        dVar56 = (dVar56 - (double)local_a38 * dVar58) - (double)puVar59 * dVar55;
        uVar36 = uVar36 + 8;
      } while (uVar36 < 0x3f8);
      if (puVar37 != (uint8_t *)0x0) {
        auVar54._8_4_ = (int)((ulong)puVar37 >> 0x20);
        auVar54._0_8_ = puVar37;
        auVar54._12_4_ = 0x45300000;
        dVar55 = auVar54._8_8_ - 1.9342813113834067e+25;
        dVar58 = dVar55 + ((double)CONCAT44(0x43300000,(int)puVar37) - 4503599627370496.0);
        if (puVar37 < (uint8_t *)0x100) {
          dVar55 = (double)(&duckdb_brotli::kBrotliLog2Table)[(long)puVar37];
        }
        else {
          uStack_a30 = 0;
          local_a38 = puVar37;
          local_9e8 = dVar58;
          dStack_9e0 = dVar55;
          dVar55 = log2(dVar58);
          dVar58 = local_9e8;
          puVar37 = local_a38;
        }
        dVar56 = dVar56 + dVar58 * dVar55;
      }
      auVar57._8_4_ = (int)((ulong)puVar37 >> 0x20);
      auVar57._0_8_ = puVar37;
      auVar57._12_4_ = 0x45300000;
      dVar58 = (auVar57._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)puVar37) - 4503599627370496.0);
      if (dVar58 <= dVar56) {
        dVar58 = dVar56;
      }
      uVar50 = local_9c0;
      if (((double)uVar46 * 7.92) / 13.0 < dVar58) goto LAB_01c05e18;
    }
    uVar3 = *puVar23;
    uVar48 = puVar23[1];
    uVar36 = storage_ix_1 & 0xff;
    iVar21 = (s->params).quality;
    if (iVar21 < 3) {
      duckdb_brotli::BrotliStoreMetaBlockFast
                (m,data,(ulong)uVar47,uVar50,mask,is_last,&s->params,local_a10,local_a28,
                 &storage_ix_1,puVar23);
    }
    else {
      local_a38 = (uint8_t *)CONCAT71(local_a38._1_7_,uVar48);
      if (iVar21 == 3) {
        duckdb_brotli::BrotliStoreMetaBlockTrivial
                  (m,data,(ulong)uVar47,uVar50,mask,is_last,&s->params,local_a10,local_a28,
                   &storage_ix_1,puVar23);
      }
      else {
        duckdb_brotli::BrotliInitBlockSplit((BlockSplit *)&table_size);
        duckdb_brotli::BrotliInitBlockSplit(&local_408);
        duckdb_brotli::BrotliInitBlockSplit(&local_3d8);
        local_368 = (undefined1  [16])0x0;
        local_378 = (undefined1  [16])0x0;
        local_388 = (undefined1  [16])0x0;
        local_398 = (undefined1  [16])0x0;
        local_3a8 = (undefined1  [16])0x0;
        dVar56 = (double)(ulong)uVar47;
        local_a40 = (uint8_t **)(ulong)bVar44;
        local_9e8 = dVar56;
        if ((s->params).quality < 10) {
          num_literal_contexts = 1;
          local_9d0 = (uint32_t *)0x0;
          if ((s->params).disable_literal_context_modeling == 0) {
            local_a18 = (uint8_t *)CONCAT44(local_a18._4_4_,(uint)bVar27);
            puVar22 = (uint32_t *)duckdb_brotli::BrotliAllocate(m,0x700);
            DecideOverLiteralContextModeling
                      (data,(size_t)dVar56,uVar50,mask,(s->params).quality,(s->params).size_hint,
                       &num_literal_contexts,&local_9d0,puVar22);
            duckdb_brotli::BrotliFree(m,puVar22);
            bVar44 = (byte)local_a40;
            bVar27 = (byte)local_a18;
          }
          duckdb_brotli::BrotliBuildMetaBlockGreedy
                    (m,data,(size_t)dVar56,mask,bVar27,bVar44,local_9d8,num_literal_contexts,
                     local_9d0,local_a10,local_a28,(MetaBlockSplit *)&table_size);
        }
        else {
          duckdb_brotli::BrotliBuildMetaBlock
                    (m,data,(size_t)dVar56,mask,(BrotliEncoderParams *)&storage_ix,bVar27,bVar44,
                     local_a10,local_a28,literal_context_mode,(MetaBlockSplit *)&table_size);
        }
        if (3 < (s->params).quality) {
          duckdb_brotli::BrotliOptimizeHistograms(local_974,(MetaBlockSplit *)&table_size);
        }
        duckdb_brotli::BrotliStoreMetaBlock
                  (m,data,(size_t)local_9e8,uVar50,mask,bVar27,(uint8_t)local_a40,is_last,
                   (BrotliEncoderParams *)&storage_ix,literal_context_mode,local_a10,local_a28,
                   (MetaBlockSplit *)&table_size,&storage_ix_1,puVar23);
        duckdb_brotli::BrotliDestroyBlockSplit(m,(BlockSplit *)&table_size);
        duckdb_brotli::BrotliDestroyBlockSplit(m,&local_408);
        duckdb_brotli::BrotliDestroyBlockSplit(m,&local_3d8);
        duckdb_brotli::BrotliFree(m,(void *)local_3a8._0_8_);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_3a8._8_8_;
        local_3a8 = auVar15 << 0x40;
        duckdb_brotli::BrotliFree(m,(void *)local_398._0_8_);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_398._8_8_;
        local_398 = auVar16 << 0x40;
        duckdb_brotli::BrotliFree(m,(void *)local_388._0_8_);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = local_388._8_8_;
        local_388 = auVar17 << 0x40;
        duckdb_brotli::BrotliFree(m,(void *)local_378._0_8_);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_378._8_8_;
        local_378 = auVar18 << 0x40;
        duckdb_brotli::BrotliFree(m,(void *)local_368._0_8_);
      }
      uVar48 = (uint8_t)local_a38;
    }
    piVar24 = local_a08;
    if (storage_ix_1 >> 3 <= uVar50 + 4) goto LAB_01c064e7;
    uVar14 = *(undefined8 *)(local_a08 + 2);
    *(undefined8 *)local_a20 = *(undefined8 *)local_a08;
    *(undefined8 *)(local_a20 + 2) = uVar14;
    *puVar23 = uVar3;
    puVar23[1] = uVar48;
    storage_ix_1 = uVar36;
  }
  piVar24 = local_a08;
  duckdb_brotli::BrotliStoreUncompressedMetaBlock
            (is_last,data,(ulong)uVar47,mask,uVar50,&storage_ix_1,puVar23);
LAB_01c064e7:
  uVar36 = storage_ix_1 >> 3;
  s->last_bytes_ = (ushort)puVar23[uVar36];
  s->last_bytes_bits_ = (byte)storage_ix_1 & 7;
  s->last_flush_pos_ = s->input_pos_;
  iVar21 = UpdateLastProcessedPos(s);
  if (iVar21 != 0) {
    (s->hasher_).common.is_prepared_ = 0;
  }
  uVar49 = s->last_flush_pos_;
  if (uVar49 != 0) {
    s->prev_byte_ = data[uVar4 & (int)uVar49 - 1U];
  }
  if (1 < uVar49) {
    s->prev_byte2_ = data[uVar4 & (int)uVar49 - 2U];
  }
  local_9f8[0] = 0;
  local_9f8[1] = 0;
  uVar14 = *(undefined8 *)(local_a20 + 2);
  *(undefined8 *)piVar24 = *(undefined8 *)local_a20;
  *(undefined8 *)(piVar24 + 2) = uVar14;
  *output = puVar23;
  *local_a00 = uVar36;
  return 1;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  uint32_t bytes = (uint32_t)delta;
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;
  ContextType literal_context_mode;
  ContextLut literal_context_lut;
  BROTLI_BOOL fast_compress =
      s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY;

  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  if (delta == 0) {  /* No new input; still might want to flush or finish. */
    if (!data) {  /* No input has been processed so far. */
      if (is_last) {  /* Emit complete finalized stream. */
        BROTLI_DCHECK(s->last_bytes_bits_ <= 14);
        s->last_bytes_ |= (uint16_t)(3u << s->last_bytes_bits_);
        s->last_bytes_bits_ = (uint8_t)(s->last_bytes_bits_ + 2u);
        s->tiny_buf_.u8[0] = (uint8_t)s->last_bytes_;
        s->tiny_buf_.u8[1] = (uint8_t)(s->last_bytes_ >> 8);
        *output = s->tiny_buf_.u8;
        *out_size = (s->last_bytes_bits_ + 7u) >> 3u;
        return BROTLI_TRUE;
      } else {  /* No data, not last -> no-op. */
        *out_size = 0;
        return BROTLI_TRUE;
      }
    } else {
      /* Fast compress performs flush every block -> flush is no-op. */
      if (!is_last && (!force_flush || fast_compress)) {  /* Another no-op. */
        *out_size = 0;
        return BROTLI_TRUE;
      }
    }
  }
  BROTLI_DCHECK(data);

  if (s->params.quality > s->params.dictionary.max_quality) return BROTLI_FALSE;
  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->command_buf_) ||
        BROTLI_IS_NULL(s->literal_buf_)) {
      return BROTLI_FALSE;
    }
  }

  if (fast_compress) {
    uint8_t* storage;
    size_t storage_ix = s->last_bytes_bits_;
    size_t table_size;
    int* table;

    storage = GetBrotliStorage(s, 2 * bytes + 503);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          s->one_pass_arena_, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          s->two_pass_arena_, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }

  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(new_commands)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hasher_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);

  literal_context_mode = ChooseContextMode(
      &s->params, data, WrapPosition(s->last_flush_pos_),
      mask, (size_t)(s->input_pos_ - s->last_flush_pos_));
  literal_context_lut = BROTLI_CONTEXT_LUT(literal_context_mode);

  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->num_commands_ && s->last_insert_len_ == 0) {
    ExtendLastCommand(s, &bytes, &wrapped_last_processed_pos);
  }

  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateHqZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
  }

  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO(eustas): Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HasherReset(&s->hasher_);
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  BROTLI_DCHECK(s->input_pos_ >= s->last_flush_pos_);
  BROTLI_DCHECK(s->input_pos_ > s->last_flush_pos_ || is_last);
  BROTLI_DCHECK(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 503);
    size_t storage_ix = s->last_bytes_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        literal_context_mode, &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HasherReset(&s->hasher_);
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->saved_dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}